

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_intersection_inplace(array_container_t *src_1,array_container_t *src_2)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  int *in_RSI;
  int *in_RDI;
  int threshold;
  int32_t card_2;
  int32_t card_1;
  uint16_t *in_stack_00000030;
  size_t in_stack_00000038;
  uint16_t *in_stack_00000040;
  size_t in_stack_00000048;
  uint16_t *in_stack_00000050;
  size_t in_stack_00000090;
  uint16_t *in_stack_00000098;
  size_t in_stack_000000a0;
  uint16_t *in_stack_000000a8;
  
  iVar1 = *in_RDI;
  iVar2 = *in_RSI;
  if (iVar1 * 0x40 < iVar2) {
    iVar3 = intersect_skewed_uint16
                      (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                       in_stack_00000030);
    *in_RDI = iVar3;
  }
  else if (iVar2 * 0x40 < iVar1) {
    iVar3 = intersect_skewed_uint16
                      (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                       in_stack_00000030);
    *in_RDI = iVar3;
  }
  else {
    uVar4 = croaring_hardware_support();
    if ((uVar4 & 1) == 0) {
      iVar3 = intersect_uint16(*(uint16_t **)(in_RDI + 2),(long)iVar1,*(uint16_t **)(in_RSI + 2),
                               (long)iVar2,*(uint16_t **)(in_RDI + 2));
      *in_RDI = iVar3;
    }
    else {
      iVar3 = intersect_vector16_inplace
                        (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090);
      *in_RDI = iVar3;
    }
  }
  return;
}

Assistant:

void array_container_intersection_inplace(array_container_t *src_1,
                                          const array_container_t *src_2) {
    int32_t card_1 = src_1->cardinality, card_2 = src_2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        src_1->cardinality = intersect_skewed_uint16(
            src_1->array, card_1, src_2->array, card_2, src_1->array);
    } else if (card_2 * threshold < card_1) {
        src_1->cardinality = intersect_skewed_uint16(
            src_2->array, card_2, src_1->array, card_1, src_1->array);
    } else {
#if CROARING_IS_X64
        if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
            src_1->cardinality = intersect_vector16_inplace(
                src_1->array, card_1, src_2->array, card_2);
        } else {
            src_1->cardinality = intersect_uint16(
                src_1->array, card_1, src_2->array, card_2, src_1->array);
        }
#else
        src_1->cardinality = intersect_uint16(
            src_1->array, card_1, src_2->array, card_2, src_1->array);
#endif
    }
}